

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<tcu::Vector<double,_3>,_tcu::Vector<double,_3>_>::call
          (unary<tcu::Vector<double,_3>,_tcu::Vector<double,_3>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  double local_70 [3];
  code *local_58;
  functionPointer p_function;
  Vector<double,_3> arg;
  Vector<double,_3> result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<tcu::Vector<double,_3>,_tcu::Vector<double,_3>_> *this_local;
  
  tcu::Vector<double,_3>::Vector((Vector<double,_3> *)(arg.m_data + 2));
  tcu::Vector<double,_3>::Vector((Vector<double,_3> *)&p_function);
  unpack<tcu::Vector<double,_3>_>::get(argument_src,(Vector<double,_3> *)&p_function);
  local_58 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  (*local_58)(local_70,&p_function);
  arg.m_data[2] = local_70[0];
  pack<tcu::Vector<double,_3>_>::set(result_dst,(Vector<double,_3> *)(arg.m_data + 2));
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}